

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDUint32x4Operation::OpMin(SIMDValue *aValue,SIMDValue *bValue)

{
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar1;
  undefined1 local_38 [8];
  SIMDValue selector;
  SIMDValue *bValue_local;
  SIMDValue *aValue_local;
  
  selector.field_0.f64[1] = (Type)bValue;
  _local_38 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)OpLessThan(aValue,bValue);
  aVar1 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          SIMDInt32x4Operation::OpSelect
                    ((SIMDValue *)local_38,aValue,(SIMDValue *)selector.field_0.f64[1]);
  return (SIMDValue)aVar1;
}

Assistant:

SIMDValue SIMDUint32x4Operation::OpMin(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        // _mm_min_epu32 is SSE4.1
        //X86SIMDValue x86Result;
        //X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        //X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);

        //x86Result.m128i_value = _mm_min_epu32(tmpaValue.m128i_value, tmpbValue.m128i_value);

        SIMDValue selector = SIMDUint32x4Operation::OpLessThan(aValue, bValue);
        return SIMDInt32x4Operation::OpSelect(selector, aValue, bValue);
    }